

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

void __thiscall
ContainerAlgorithms::
DefaultDeleter<std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>,_false>
::operator()(DefaultDeleter<std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>,_false>
             *this,value_type value)

{
  if (value != (value_type)0x0) {
    cmGeneratorExpressionEvaluationFile::~cmGeneratorExpressionEvaluationFile(value);
  }
  operator_delete(value,0x50);
  return;
}

Assistant:

void operator()(typename Range::value_type value) const { delete value; }